

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  int __oflag;
  bool bVar3;
  BMPReader bmpReader;
  JPG jpg;
  string path;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"start");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&path,
             "/workspace/llm4binary/github/license_c_cmakelists/Cheemion[P]JPEG_COMPRESS/resource/",
             (allocator<char> *)&jpg);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&jpg,&path,
                 "example.bmp");
  std::__cxx11::string::operator=((string *)&path,(string *)&jpg);
  std::__cxx11::string::~string((string *)&jpg);
  bmpReader.height = 0;
  bmpReader.width = 0;
  bmpReader.paddingBytes = 0;
  bmpReader.data = (RGB *)0x0;
  iVar1 = BMPReader::open(&bmpReader,(char *)&path,__oflag);
  bVar3 = (char)iVar1 == '\0';
  if (bVar3) {
    std::operator<<((ostream *)&std::cout,"Error - canot open file\n");
  }
  else {
    JPG::JPG(&jpg,bmpReader.width,bmpReader.height,bmpReader.data,'\x02','\x02','\x01','\x02','\x02'
             ,'\x01');
    JPG::convertToYCbCr(&jpg);
    JPG::subsampling(&jpg);
    printJPG(&jpg);
    poVar2 = std::operator<<((ostream *)&std::cout,"end");
    std::endl<char,std::char_traits<char>>(poVar2);
    JPG::~JPG(&jpg);
  }
  BMPReader::~BMPReader(&bmpReader);
  std::__cxx11::string::~string((string *)&path);
  return (uint)bVar3;
}

Assistant:

int main() {
    std::cout << "start" << std::endl;
    std::string path(RESOURCE_PATH);
    path = path + "example.bmp";
    BMPReader bmpReader;
    if(!bmpReader.open(path)) {
        std::cout << "Error - canot open file\n" ;
        return 1;
    }
    JPG jpg(bmpReader.width, bmpReader.height, bmpReader.data, 2, 2, 1, 2, 2, 1) ;
    jpg.convertToYCbCr();
    jpg.subsampling();
    printJPG(jpg);

   // jpg.discreteCosineTransform();
   // jpg.quantization();
   // jpg.huffmanCoding();
   // std::string jpgPath(EXAMPLE_PATH_JPG);
   // jpg.output(jpgPath);
    std::cout << "end" << std::endl;
    return 0;
}